

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::removeSatisfied(Solver *this,vec<unsigned_int,_int> *cs)

{
  bool bVar1;
  anon_struct_4_5_613047fb_for_header *c;
  long lVar2;
  int k;
  int iVar3;
  int iVar4;
  RegionAllocator<unsigned_int> *this_00;
  long lVar5;
  lbool local_47;
  lbool local_46;
  lbool local_45;
  int local_44;
  RegionAllocator<unsigned_int> *local_40;
  vec<unsigned_int,_int> *local_38;
  
  this_00 = &(this->ca).ra;
  lVar5 = 0;
  local_44 = 0;
  local_40 = this_00;
  local_38 = cs;
  do {
    if (cs->sz <= lVar5) {
      vec<unsigned_int,_int>::shrink(cs,(int)lVar5 - local_44);
      return;
    }
    c = (anon_struct_4_5_613047fb_for_header *)
        RegionAllocator<unsigned_int>::operator[](this_00,cs->data[lVar5]);
    bVar1 = satisfied(this,(Clause *)c);
    if (bVar1) {
      removeClause(this,cs->data[lVar5]);
    }
    else {
      local_45 = value(this,(Lit)*(int *)(c + 1));
      bVar1 = lbool::operator==(&local_45,l_Undef);
      if (!bVar1) {
LAB_00109818:
        __assert_fail("value(c[0]) == l_Undef && value(c[1]) == l_Undef",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                      ,0x262,"void Minisat::Solver::removeSatisfied(vec<CRef> &)");
      }
      local_46 = value(this,(Lit)*(int *)(c + 2));
      bVar1 = lbool::operator==(&local_46,l_Undef);
      if (!bVar1) goto LAB_00109818;
      iVar4 = 2;
      while (iVar4 < (int)((uint)*c >> 5)) {
        local_47 = value(this,(Lit)*(int *)(c + (long)iVar4 + 1));
        bVar1 = lbool::operator==(&local_47,l_False);
        iVar3 = iVar4;
        if (bVar1) {
          iVar3 = iVar4 + -1;
          c[(long)iVar4 + 1] = c[(uint)*c >> 5];
          Clause::pop((Clause *)c);
        }
        iVar4 = iVar3 + 1;
      }
      lVar2 = (long)local_44;
      local_44 = local_44 + 1;
      local_38->data[lVar2] = local_38->data[lVar5];
      cs = local_38;
      this_00 = local_40;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void Solver::removeSatisfied(vec<CRef>& cs)
{
    int i, j;
    for (i = j = 0; i < cs.size(); i++){
        Clause& c = ca[cs[i]];
        if (satisfied(c))
            removeClause(cs[i]);
        else{
            // Trim clause:
            assert(value(c[0]) == l_Undef && value(c[1]) == l_Undef);
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) == l_False){
                    c[k--] = c[c.size()-1];
                    c.pop();
                }
            cs[j++] = cs[i];
        }
    }
    cs.shrink(i - j);
}